

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os_clock_linux.c
# Opt level: O0

int os_clock_linux_gettime64(uint64_t *t64)

{
  undefined1 local_40 [8];
  timespec ts;
  undefined1 auStack_28 [4];
  int error;
  timeval tv;
  uint64_t *t64_local;
  
  tv.tv_usec = (__suseconds_t)t64;
  if (_clock_source == 0) {
    t64_local._4_4_ = gettimeofday((timeval *)auStack_28,(__timezone_ptr_t)0x0);
    if (t64_local._4_4_ == 0) {
      _auStack_28 = os_clock_linux_gettime64::offset + _auStack_28;
      if (os_clock_linux_gettime64::last_sec == 0) {
        os_clock_linux_gettime64::last_sec = _auStack_28;
      }
      if ((_auStack_28 < os_clock_linux_gettime64::last_sec) ||
         (os_clock_linux_gettime64::last_sec + 0x3c < _auStack_28)) {
        os_clock_linux_gettime64::offset =
             (os_clock_linux_gettime64::last_sec - _auStack_28) + os_clock_linux_gettime64::offset;
        _auStack_28 = os_clock_linux_gettime64::last_sec;
      }
      os_clock_linux_gettime64::last_sec = _auStack_28;
      *(ulong *)tv.tv_usec = _auStack_28 * 1000 + (ulong)tv.tv_sec / 1000;
      t64_local._4_4_ = 0;
    }
  }
  else {
    t64_local._4_4_ = clock_gettime(_clock_source,(timespec *)local_40);
    if (t64_local._4_4_ == 0) {
      *(ulong *)tv.tv_usec = (long)local_40 * 1000 + (ulong)ts.tv_sec / 1000000;
      t64_local._4_4_ = 0;
    }
  }
  return t64_local._4_4_;
}

Assistant:

int
os_clock_linux_gettime64(uint64_t *t64) {
  static time_t offset = 0, last_sec = 0;
  struct timeval tv;
  int error;

#if defined(CLOCK_MONOTONIC_RAW) || defined(CLOCK_MONOTONIC)
  if (_clock_source) {
    struct timespec ts;

    if ((error = clock_gettime(_clock_source, &ts)) != 0) {
      return error;
    }

    *t64 = 1000ull * ts.tv_sec + ts.tv_nsec / 1000000ull;
    return 0;
  }
#endif
  if ((error = gettimeofday(&tv, NULL)) != 0) {
    return error;
  }

  tv.tv_sec += offset;
  if (last_sec == 0) {
    last_sec = tv.tv_sec;
  }
  if (tv.tv_sec < last_sec || tv.tv_sec > last_sec + 60) {
    offset += last_sec - tv.tv_sec;
    tv.tv_sec = last_sec;
  }
  last_sec = tv.tv_sec;

  *t64 = 1000ull * tv.tv_sec + tv.tv_usec / 1000ull;
  return 0;
}